

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O2

bool IncludeByVariable(cmExecutionStatus *status,string *variable)

{
  cmMakefile *this;
  bool bVar1;
  cmValue in_path;
  string *in_base;
  bool bVar2;
  string sStack_c8;
  string includeFile;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  this = status->Makefile;
  in_path = cmMakefile::GetDefinition(this,variable);
  if (in_path.Value == (string *)0x0) {
    return true;
  }
  in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath(&includeFile,in_path.Value,in_base);
  bVar1 = cmsys::SystemTools::FileExists(&includeFile);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileIsDirectory(&includeFile);
    if (bVar1) {
      local_58.View_._M_len = 0x21;
      local_58.View_._M_str = "requested file is a directory:\n  ";
      local_88.View_._M_str = ((in_path.Value)->_M_dataplus)._M_p;
      local_88.View_._M_len = (in_path.Value)->_M_string_length;
      cmStrCat<>(&sStack_c8,&local_58,&local_88);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      bVar1 = cmMakefile::ReadDependentFile(this,in_path.Value,true);
      bVar2 = true;
      if ((bVar1) || (bVar1 = cmSystemTools::GetFatalErrorOccurred(), bVar1)) goto LAB_002c5b65;
      local_58.View_._M_len = 0x21;
      local_58.View_._M_str = "could not load requested file:\n  ";
      local_88.View_._M_str = ((in_path.Value)->_M_dataplus)._M_p;
      local_88.View_._M_len = (in_path.Value)->_M_string_length;
      cmStrCat<>(&sStack_c8,&local_58,&local_88);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  else {
    local_58.View_._M_len = 0x21;
    local_58.View_._M_str = "could not find requested file:\n  ";
    local_88.View_._M_str = ((in_path.Value)->_M_dataplus)._M_p;
    local_88.View_._M_len = (in_path.Value)->_M_string_length;
    cmStrCat<>(&sStack_c8,&local_58,&local_88);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)&sStack_c8);
  bVar2 = false;
LAB_002c5b65:
  std::__cxx11::string::~string((string *)&includeFile);
  return bVar2;
}

Assistant:

static bool IncludeByVariable(cmExecutionStatus& status,
                              const std::string& variable)
{
  cmMakefile& mf = status.GetMakefile();
  cmValue include = mf.GetDefinition(variable);
  if (!include) {
    return true;
  }

  std::string includeFile =
    cmSystemTools::CollapseFullPath(*include, mf.GetCurrentSourceDirectory());
  if (!cmSystemTools::FileExists(includeFile)) {
    status.SetError(cmStrCat("could not find requested file:\n  ", *include));
    return false;
  }
  if (cmSystemTools::FileIsDirectory(includeFile)) {
    status.SetError(cmStrCat("requested file is a directory:\n  ", *include));
    return false;
  }

  const bool readit = mf.ReadDependentFile(*include);
  if (readit) {
    return true;
  }

  if (cmSystemTools::GetFatalErrorOccurred()) {
    return true;
  }

  status.SetError(cmStrCat("could not load requested file:\n  ", *include));
  return false;
}